

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData256::PushBack<cfd::core::ByteData>
          (ByteData *__return_storage_ptr__,ByteData256 *this,ByteData *back_insert_data)

{
  pointer *this_00;
  iterator __first;
  iterator __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  const_iterator local_68;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> insert_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  ByteData *back_insert_data_local;
  ByteData256 *this_local;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &insert_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,&this->data_);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                     back_insert_data);
  this_00 = &insert_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_70._M_current =
       (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_68,&local_70);
  __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,local_68,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &insert_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &insert_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

ByteData PushBack(const ByteDataClass& back_insert_data) const {
    std::vector<uint8_t> result(data_);
    std::vector<uint8_t> insert_bytes = back_insert_data.GetBytes();
    result.insert(result.end(), insert_bytes.begin(), insert_bytes.end());
    return ByteData(result);
  }